

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O2

void __thiscall avro::NodeSymbolic::printJson(NodeSymbolic *this,ostream *os,int depth)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,'\"');
  poVar1 = operator<<(poVar1,&(this->super_NodeImplSymbolic).nameAttribute_.attr_);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void 
NodeSymbolic::printJson(std::ostream &os, int depth) const
{
    os << '\"' << nameAttribute_.get() << '\"';
}